

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.hpp
# Opt level: O2

IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:344:20)>_>
* __thiscall
Kernel::AlascaState::selectedSummands
          (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:344:20)>_>
           *__return_storage_ptr__,AlascaState *this,Clause *cl,SelectionCriterion selLit,
          SelectionCriterion selTerm,bool includeUnshieldedNumberVariables)

{
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>
  FStack_88;
  
  selectedActivePositions
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_OrderingUtils_hpp:276:20)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_State_hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>_>
              *)&FStack_88,this,cl,selLit,selTerm,includeUnshieldedNumberVariables);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,Kernel::OrderingUtils::maxElems<Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1}>(unsigned_int,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int,unsigned_int)#1},Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(unsigned_int)#1},Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1}>,Kernel::AlascaState::maxLits(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion)::{lambda(auto:1)#1},Kernel::SelectedLiteral>,Kernel::AlascaState::selectedActivePositions(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::{lambda(auto:1)#1},Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,Kernel::SelectedUninterpretedEquality,Kernel::SelectedUninterpretedPredicate>>>>>
  ::
  filterMap<Kernel::AlascaState::selectedSummands(Kernel::Clause*,Kernel::OrderingUtils::SelectionCriterion,Kernel::OrderingUtils::SelectionCriterion,bool)::_lambda(auto:1)_1_>
            (__return_storage_ptr__,&FStack_88);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::FilterMapIter<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/OrderingUtils.hpp:276:20)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:77:14),_Kernel::SelectedLiteral>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/State.hpp:227:18),_Lib::VirtualIterator<Lib::Coproduct<Kernel::SelectedSummand,_Kernel::SelectedUninterpretedEquality,_Kernel::SelectedUninterpretedPredicate>_>_>_>
  ::~FlatteningIterator(&FStack_88);
  return __return_storage_ptr__;
}

Assistant:

auto selectedSummands(Clause* cl, SelectionCriterion selLit, SelectionCriterion selTerm, bool includeUnshieldedNumberVariables) {
      using Out = SelectedSummand;
      return selectedActivePositions(cl, selLit, selTerm, includeUnshieldedNumberVariables)
        .filterMap([](auto x) -> Option<Out> {
            return x.match(
                 [](SelectedSummand& x) 
                 { return Option<Out>(std::move(x)); },

                 [](SelectedUninterpretedEquality&) 
                 { return Option<Out>(); },

                 [](SelectedUninterpretedPredicate&) 
                 { return Option<Out>(); });
        });
    }